

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlChar * xmlSchemaStrip(xmlChar *value)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  bool bVar3;
  xmlChar *f;
  xmlChar *end;
  xmlChar *start;
  xmlChar *value_local;
  
  end = value;
  if (value == (xmlChar *)0x0) {
    value_local = (xmlChar *)0x0;
  }
  else {
    while( true ) {
      bVar3 = false;
      if (((*end != '\0') && (bVar3 = true, *end != ' ')) &&
         ((*end < 9 || (bVar3 = true, 10 < *end)))) {
        bVar3 = *end == '\r';
      }
      if (!bVar3) break;
      end = end + 1;
    }
    for (f = end; pxVar2 = f, *f != '\0'; f = f + 1) {
    }
    do {
      pxVar1 = f;
      f = pxVar1 + -1;
      bVar3 = false;
      if (((end < f) && (bVar3 = true, *f != ' ')) && ((*f < 9 || (bVar3 = true, 10 < *f)))) {
        bVar3 = *f == '\r';
      }
    } while (bVar3);
    if ((end == value) && (pxVar2 == pxVar1)) {
      value_local = (xmlChar *)0x0;
    }
    else {
      value_local = xmlStrndup(end,(int)pxVar1 - (int)end);
    }
  }
  return value_local;
}

Assistant:

static xmlChar *
xmlSchemaStrip(const xmlChar *value) {
    const xmlChar *start = value, *end, *f;

    if (value == NULL) return(NULL);
    while ((*start != 0) && (IS_BLANK_CH(*start))) start++;
    end = start;
    while (*end != 0) end++;
    f = end;
    end--;
    while ((end > start) && (IS_BLANK_CH(*end))) end--;
    end++;
    if ((start == value) && (f == end)) return(NULL);
    return(xmlStrndup(start, end - start));
}